

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DefaultClockingReferenceSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultClockingReferenceSyntax,slang::syntax::DefaultClockingReferenceSyntax_const&>
          (BumpAllocator *this,DefaultClockingReferenceSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  Info *pIVar6;
  undefined4 uVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  TokenKind TVar15;
  undefined1 uVar16;
  NumericTokenFlags NVar17;
  uint32_t uVar18;
  TokenKind TVar19;
  undefined1 uVar20;
  NumericTokenFlags NVar21;
  uint32_t uVar22;
  DefaultClockingReferenceSyntax *pDVar23;
  
  pDVar23 = (DefaultClockingReferenceSyntax *)allocate(this,0x90,8);
  uVar7 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pDVar23->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pDVar23->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar7;
  (pDVar23->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  (pDVar23->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar7 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pDVar23->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pDVar23->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar7
  ;
  (pDVar23->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pDVar23->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pDVar23->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005e7db0;
  (pDVar23->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pDVar23->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pDVar23->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pDVar23->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005e8088;
  TVar19 = (args->defaultKeyword).kind;
  uVar20 = (args->defaultKeyword).field_0x2;
  NVar21.raw = (args->defaultKeyword).numFlags.raw;
  uVar22 = (args->defaultKeyword).rawLen;
  pIVar3 = (args->defaultKeyword).info;
  TVar15 = (args->clocking).kind;
  uVar16 = (args->clocking).field_0x2;
  NVar17.raw = (args->clocking).numFlags.raw;
  uVar18 = (args->clocking).rawLen;
  pIVar4 = (args->clocking).info;
  TVar11 = (args->name).kind;
  uVar12 = (args->name).field_0x2;
  NVar13.raw = (args->name).numFlags.raw;
  uVar14 = (args->name).rawLen;
  pIVar5 = (args->name).info;
  uVar8 = (args->semi).field_0x2;
  NVar9.raw = (args->semi).numFlags.raw;
  uVar10 = (args->semi).rawLen;
  pIVar6 = (args->semi).info;
  (pDVar23->semi).kind = (args->semi).kind;
  (pDVar23->semi).field_0x2 = uVar8;
  (pDVar23->semi).numFlags = (NumericTokenFlags)NVar9.raw;
  (pDVar23->semi).rawLen = uVar10;
  (pDVar23->semi).info = pIVar6;
  (pDVar23->name).kind = TVar11;
  (pDVar23->name).field_0x2 = uVar12;
  (pDVar23->name).numFlags = (NumericTokenFlags)NVar13.raw;
  (pDVar23->name).rawLen = uVar14;
  (pDVar23->name).info = pIVar5;
  (pDVar23->clocking).kind = TVar15;
  (pDVar23->clocking).field_0x2 = uVar16;
  (pDVar23->clocking).numFlags = (NumericTokenFlags)NVar17.raw;
  (pDVar23->clocking).rawLen = uVar18;
  (pDVar23->clocking).info = pIVar4;
  (pDVar23->defaultKeyword).kind = TVar19;
  (pDVar23->defaultKeyword).field_0x2 = uVar20;
  (pDVar23->defaultKeyword).numFlags = (NumericTokenFlags)NVar21.raw;
  (pDVar23->defaultKeyword).rawLen = uVar22;
  (pDVar23->defaultKeyword).info = pIVar3;
  return pDVar23;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }